

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_Target * GPU_CreateAliasTarget(GPU_Target *target)

{
  GPU_Target *target_local;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    target_local = (GPU_Target *)0x0;
  }
  else {
    if (((_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) &&
        (target != (GPU_Target *)0x0)) && (target->context != (GPU_Context *)0x0)) {
      GPU_MakeCurrent(target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) {
      target_local = (GPU_Target *)0x0;
    }
    else {
      target_local = (*_gpu_current_renderer->impl->CreateAliasTarget)(_gpu_current_renderer,target)
      ;
    }
  }
  return target_local;
}

Assistant:

GPU_Target* GPU_CreateAliasTarget(GPU_Target* target)
{
    if(!CHECK_RENDERER)
        return NULL;
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        return NULL;

    return _gpu_current_renderer->impl->CreateAliasTarget(_gpu_current_renderer, target);
}